

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O0

void __thiscall
defyx::AssemblyGeneratorX86::generateProgram(AssemblyGeneratorX86 *this,Program *prog)

{
  uint32_t uVar1;
  ostream *poVar2;
  Instruction *pIVar3;
  Program *in_RSI;
  string *in_RDI;
  Instruction *instr;
  uint i_1;
  uint i;
  uint uVar4;
  uint pc;
  undefined4 in_stack_ffffffffffffffbc;
  AssemblyGeneratorX86 *in_stack_ffffffffffffffc0;
  string local_38 [36];
  uint local_14;
  Program *local_10;
  
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    *(undefined4 *)(in_RDI + (ulong)local_14 * 4 + 0x188) = 0xffffffff;
  }
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38);
  std::__cxx11::stringstream::str(in_RDI);
  std::__cxx11::string::~string(local_38);
  uVar4 = 0;
  while( true ) {
    pc = uVar4;
    uVar1 = Program::getSize(local_10);
    if (uVar1 <= uVar4) break;
    poVar2 = std::operator<<((ostream *)(in_RDI + 0x10),"defyx_isn_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pc);
    poVar2 = std::operator<<(poVar2,":");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pIVar3 = Program::operator()(local_10,pc);
    pIVar3->src = pIVar3->src % 8;
    pIVar3->dst = pIVar3->dst % 8;
    generateCode(in_stack_ffffffffffffffc0,(Instruction *)CONCAT44(in_stack_ffffffffffffffbc,pc),
                 (int)((ulong)pIVar3 >> 0x20));
    uVar4 = pc + 1;
  }
  return;
}

Assistant:

void AssemblyGeneratorX86::generateProgram(Program& prog) {
		for (unsigned i = 0; i < RegistersCount; ++i) {
			registerUsage[i] = -1;
		}
		asmCode.str(std::string()); //clear
		for (unsigned i = 0; i < prog.getSize(); ++i) {
			asmCode << "defyx_isn_" << i << ":" << std::endl;
			Instruction& instr = prog(i);
			instr.src %= RegistersCount;
			instr.dst %= RegistersCount;
			generateCode(instr, i);
		}
	}